

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void ConvertPtrWrap(CodeGenRegVmStateContext *vmState,uint targetTypeId,uint sourceTypeId)

{
  CodeGenRegVmContext *pCVar1;
  uint uVar2;
  char local_428 [8];
  char buf [1024];
  uint bufSize;
  CodeGenRegVmContext *ctx;
  uint sourceTypeId_local;
  uint targetTypeId_local;
  CodeGenRegVmStateContext *vmState_local;
  
  pCVar1 = vmState->ctx;
  uVar2 = ConvertFromAutoRef(targetTypeId,sourceTypeId);
  if (uVar2 == 0) {
    vmState->callStackTop->instruction = vmState->callInstructionPos + 1;
    vmState->callStackTop = vmState->callStackTop + 1;
    buf[0x3fc] = '\0';
    buf[0x3fd] = '\x04';
    buf[0x3fe] = '\0';
    buf[0x3ff] = '\0';
    NULLC::SafeSprintf(local_428,0x400,"ERROR: cannot convert from %s ref to %s ref",
                       pCVar1->exSymbols + pCVar1->exTypes[sourceTypeId].offsetToName,
                       pCVar1->exSymbols + pCVar1->exTypes[targetTypeId].offsetToName);
    ExecutorX86::Stop(pCVar1->x86rvm,local_428);
    longjmp((__jmp_buf_tag *)vmState,1);
  }
  return;
}

Assistant:

void ConvertPtrWrap(CodeGenRegVmStateContext *vmState, unsigned targetTypeId, unsigned sourceTypeId)
{
	CodeGenRegVmContext &ctx = *vmState->ctx;

	if(!ConvertFromAutoRef(targetTypeId, sourceTypeId))
	{
		vmState->callStackTop->instruction = vmState->callInstructionPos + 1;
		vmState->callStackTop++;

		const unsigned bufSize = 1024;
		char buf[bufSize];

		NULLC::SafeSprintf(buf, bufSize, "ERROR: cannot convert from %s ref to %s ref", &ctx.exSymbols[ctx.exTypes[sourceTypeId].offsetToName], &ctx.exSymbols[ctx.exTypes[targetTypeId].offsetToName]);

		ctx.x86rvm->Stop(buf);

		longjmp(vmState->errorHandler, 1);
	}
}